

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean process_restart(j_decompress_ptr cinfo)

{
  long lVar1;
  int iVar2;
  undefined8 in_RSI;
  long in_RDI;
  int ci;
  phuff_entropy_ptr_conflict entropy;
  undefined4 local_1c;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x250);
  iVar2 = *(int *)(lVar1 + 0x20);
  *(int *)(*(long *)(in_RDI + 0x248) + 0x24) =
       iVar2 / 8 + *(int *)(*(long *)(in_RDI + 0x248) + 0x24);
  *(undefined4 *)(lVar1 + 0x20) = 0;
  iVar2 = (**(code **)(*(long *)(in_RDI + 0x248) + 0x10))
                    (in_RDI,in_RSI,(long)iVar2 % 8 & 0xffffffff);
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x1b0); local_1c = local_1c + 1) {
      *(undefined4 *)(lVar1 + 0x2c + (long)local_1c * 4) = 0;
    }
    *(undefined4 *)(lVar1 + 0x28) = 0;
    *(undefined4 *)(lVar1 + 0x3c) = *(undefined4 *)(in_RDI + 0x170);
    if (*(int *)(in_RDI + 0x21c) == 0) {
      *(undefined4 *)(lVar1 + 0x10) = 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

LOCAL(boolean)
process_restart(j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->pub.insufficient_data = FALSE;

  return TRUE;
}